

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall dxil_spv::Converter::Impl::emit_execution_modes_hull(Impl *this)

{
  ExecutionMode mode;
  uint uVar1;
  uint value1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Builder *this_00;
  MDOperand *pMVar5;
  MDNode *this_01;
  ConstantAsMetadata *this_02;
  Constant *value;
  Function *pFVar6;
  Function *entryPoint;
  void *pvVar7;
  LoggingCallback p_Var8;
  byte bVar9;
  ExecutionMode mode_00;
  char *__ptr;
  size_t sStack_1050;
  char buffer [4096];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  spv::Builder::addCapability(this_00,CapabilityTessellation);
  pMVar5 = get_shader_property_tag(this->entry_point_meta,HSState);
  if (pMVar5 == (MDOperand *)0x0) {
    return false;
  }
  this_01 = LLVMBC::cast<LLVMBC::MDNode>(pMVar5);
  pMVar5 = LLVMBC::MDNode::getOperand(this_01,0);
  this_02 = LLVMBC::cast<LLVMBC::ConstantAsMetadata>(pMVar5);
  value = LLVMBC::ConstantAsMetadata::getValue(this_02);
  pFVar6 = LLVMBC::cast<LLVMBC::Function>(&value->super_Value);
  (this->execution_mode_meta).patch_constant_function = pFVar6;
  uVar1 = get_constant_metadata<unsigned_int>(this_01,1);
  value1 = get_constant_metadata<unsigned_int>(this_01,2);
  uVar2 = get_constant_metadata<unsigned_int>(this_01,3);
  uVar3 = get_constant_metadata<unsigned_int>(this_01,4);
  mode_00 = ExecutionModeVertexOrderCcw;
  uVar4 = get_constant_metadata<unsigned_int>(this_01,5);
  entryPoint = SPIRVModule::get_entry_function(this->spirv_module);
  bVar9 = (char)uVar2 - 1;
  if (2 < bVar9) {
    p_Var8 = get_thread_log_callback();
    if (p_Var8 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"tor domain!\n",0xd);
LAB_0011b80b:
      builtin_strncpy(buffer,"Unknown tessella",0x10);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar7,Error,buffer);
      return false;
    }
    __ptr = "[ERROR]: Unknown tessellator domain!\n";
    sStack_1050 = 0x25;
LAB_0011b936:
    fwrite(__ptr,sStack_1050,1,_stderr);
    fflush(_stderr);
    return false;
  }
  spv::Builder::addExecutionMode
            (this_00,entryPoint,*(ExecutionMode *)(&DAT_001a0620 + (ulong)bVar9 * 4),-1,-1,-1);
  switch(uVar3 & 0xff) {
  case 2:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 == (LoggingCallback)0x0) {
      fwrite("[ERROR]: Emulating Pow2 spacing as Integer.\n",0x2c,1,_stderr);
      fflush(_stderr);
    }
    else {
      builtin_strncpy(buffer,"Emulating Pow2 spacing as Integer.\n",0x24);
      pvVar7 = get_thread_log_callback_userdata();
      (*p_Var8)(pvVar7,Error,buffer);
    }
  case 1:
    mode = ExecutionModeSpacingEqual;
    break;
  case 3:
    mode = ExecutionModeSpacingFractionalOdd;
    break;
  case 4:
    mode = ExecutionModeSpacingFractionalEven;
    break;
  default:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"tor partitioning.\n",0x13);
      goto LAB_0011b80b;
    }
    __ptr = "[ERROR]: Unknown tessellator partitioning.\n";
    sStack_1050 = 0x2b;
    goto LAB_0011b936;
  }
  spv::Builder::addExecutionMode(this_00,entryPoint,mode,-1,-1,-1);
  switch(uVar4 & 0xff) {
  case 1:
    mode_00 = ExecutionModePointMode;
    break;
  case 2:
    goto switchD_0011b85b_caseD_2;
  case 3:
    mode_00 = ExecutionModeVertexOrderCw;
    break;
  case 4:
    break;
  default:
    p_Var8 = get_thread_log_callback();
    if (p_Var8 != (LoggingCallback)0x0) {
      builtin_strncpy(buffer + 0x10,"tor primitive.\n",0xf);
      buffer._31_4_ = buffer._31_4_ & 0xffffff00;
      goto LAB_0011b80b;
    }
    __ptr = "[ERROR]: Unknown tessellator primitive.\n";
    sStack_1050 = 0x28;
    goto LAB_0011b936;
  }
  spv::Builder::addExecutionMode(this_00,entryPoint,mode_00,-1,-1,-1);
switchD_0011b85b_caseD_2:
  spv::Builder::addExecutionMode(this_00,entryPoint,ExecutionModeOutputVertices,value1,-1,-1);
  (this->execution_mode_meta).stage_input_num_vertex = uVar1;
  (this->execution_mode_meta).stage_output_num_vertex = value1;
  return true;
}

Assistant:

bool Converter::Impl::emit_execution_modes_hull()
{
	auto &builder = spirv_module.get_builder();
	builder.addCapability(spv::CapabilityTessellation);
	auto *hs_state_node = get_shader_property_tag(entry_point_meta, DXIL::ShaderPropertyTag::HSState);

	if (hs_state_node)
	{
		auto *arguments = llvm::cast<llvm::MDNode>(*hs_state_node);

		auto *patch_constant = llvm::cast<llvm::ConstantAsMetadata>(arguments->getOperand(0));
		auto *patch_constant_value = patch_constant->getValue();
		execution_mode_meta.patch_constant_function = llvm::cast<llvm::Function>(patch_constant_value);

		unsigned input_control_points = get_constant_metadata(arguments, 1);
		unsigned output_control_points = get_constant_metadata(arguments, 2);
		auto domain = static_cast<DXIL::TessellatorDomain>(get_constant_metadata(arguments, 3));
		auto partitioning = static_cast<DXIL::TessellatorPartitioning>(get_constant_metadata(arguments, 4));
		auto primitive = static_cast<DXIL::TessellatorOutputPrimitive>(get_constant_metadata(arguments, 5));

		auto *func = spirv_module.get_entry_function();

		switch (domain)
		{
		case DXIL::TessellatorDomain::IsoLine:
			builder.addExecutionMode(func, spv::ExecutionModeIsolines);
			break;

		case DXIL::TessellatorDomain::Tri:
			builder.addExecutionMode(func, spv::ExecutionModeTriangles);
			break;

		case DXIL::TessellatorDomain::Quad:
			builder.addExecutionMode(func, spv::ExecutionModeQuads);
			break;

		default:
			LOGE("Unknown tessellator domain!\n");
			return false;
		}

		switch (partitioning)
		{
		case DXIL::TessellatorPartitioning::Integer:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::Pow2:
			LOGE("Emulating Pow2 spacing as Integer.\n");
			builder.addExecutionMode(func, spv::ExecutionModeSpacingEqual);
			break;

		case DXIL::TessellatorPartitioning::FractionalEven:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalEven);
			break;

		case DXIL::TessellatorPartitioning::FractionalOdd:
			builder.addExecutionMode(func, spv::ExecutionModeSpacingFractionalOdd);
			break;

		default:
			LOGE("Unknown tessellator partitioning.\n");
			return false;
		}

		switch (primitive)
		{
		case DXIL::TessellatorOutputPrimitive::TriangleCCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCcw);
			break;

		case DXIL::TessellatorOutputPrimitive::TriangleCW:
			builder.addExecutionMode(func, spv::ExecutionModeVertexOrderCw);
			break;

		case DXIL::TessellatorOutputPrimitive::Point:
			builder.addExecutionMode(func, spv::ExecutionModePointMode);
			// TODO: Do we have to specify CCW/CW in point mode?
			break;

		case DXIL::TessellatorOutputPrimitive::Line:
			break;

		default:
			LOGE("Unknown tessellator primitive.\n");
			return false;
		}

		builder.addExecutionMode(func, spv::ExecutionModeOutputVertices, output_control_points);

		execution_mode_meta.stage_input_num_vertex = input_control_points;
		execution_mode_meta.stage_output_num_vertex = output_control_points;
		return true;
	}
	else
		return false;
}